

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int libssh2_session_banner_set(LIBSSH2_SESSION *session,char *banner)

{
  uchar *puVar1;
  size_t local_30;
  size_t banner_len;
  char *banner_local;
  LIBSSH2_SESSION *session_local;
  
  if (banner == (char *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = strlen(banner);
  }
  if ((session->local).banner != (uchar *)0x0) {
    (*session->free)((session->local).banner,&session->abstract);
    (session->local).banner = (uchar *)0x0;
  }
  if (local_30 == 0) {
    session_local._4_4_ = 0;
  }
  else {
    puVar1 = (uchar *)(*session->alloc)(local_30 + 3,&session->abstract);
    (session->local).banner = puVar1;
    if ((session->local).banner == (uchar *)0x0) {
      session_local._4_4_ = _libssh2_error(session,-6,"Unable to allocate memory for local banner");
    }
    else {
      memcpy((session->local).banner,banner,local_30);
      (session->local).banner[local_30] = '\0';
      (session->local).banner[local_30] = '\r';
      (session->local).banner[local_30 + 1] = '\n';
      (session->local).banner[local_30 + 2] = '\0';
      session_local._4_4_ = 0;
    }
  }
  return session_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_session_banner_set(LIBSSH2_SESSION * session, const char *banner)
{
    size_t banner_len = banner ? strlen(banner) : 0;

    if(session->local.banner) {
        LIBSSH2_FREE(session, session->local.banner);
        session->local.banner = NULL;
    }

    if(!banner_len)
        return 0;

    session->local.banner = LIBSSH2_ALLOC(session, banner_len + 3);
    if(!session->local.banner) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate memory for local banner");
    }

    memcpy(session->local.banner, banner, banner_len);

    /* first zero terminate like this so that the debug output is nice */
    session->local.banner[banner_len] = '\0';
    _libssh2_debug((session, LIBSSH2_TRACE_TRANS, "Setting local Banner: %s",
                   session->local.banner));
    session->local.banner[banner_len++] = '\r';
    session->local.banner[banner_len++] = '\n';
    session->local.banner[banner_len] = '\0';

    return 0;
}